

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O2

void wallet::coinselector_tests::SelectCoins_effective_value_test_invoker(void)

{
  long lVar1;
  unit_test_log_t *puVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  pointer local_b98;
  pointer local_b90;
  char *local_b88;
  char *local_b80;
  pointer local_b78;
  pointer local_b70;
  char *local_b68;
  char *local_b60;
  pointer local_b58;
  pointer local_b50;
  char *local_b48;
  char *local_b40;
  pointer local_b38;
  pointer local_b30;
  char *local_b28;
  char *local_b20;
  pointer local_b18;
  pointer local_b10;
  char *local_b08;
  char *local_b00;
  basic_wrap_stringstream<char> local_af8;
  SelectCoins_effective_value_test t;
  
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_b08 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_b00 = "";
  memset((basic_wrap_stringstream<char> *)&t,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream((basic_wrap_stringstream<char> *)&t)
  ;
  std::operator<<((ostream *)&t,'\"');
  std::operator<<((ostream *)&t,"SelectCoins_effective_value_test");
  std::operator<<((ostream *)&t,"\" fixture ctor");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_((basic_wrap_stringstream<char> *)&t)
  ;
  local_b18 = (pbVar3->_M_dataplus)._M_p;
  local_b10 = local_b18 + pbVar3->_M_string_length;
  file.m_end = (iterator)0x5e9;
  file.m_begin = (iterator)&local_b08;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file,(size_t)&local_b18,msg);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream
            ((basic_wrap_stringstream<char> *)&t);
  SelectCoins_effective_value_test::SelectCoins_effective_value_test(&t);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_b28 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_b20 = "";
  memset(&local_af8,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_af8);
  std::operator<<((ostream *)&local_af8,'\"');
  std::operator<<((ostream *)&local_af8,"SelectCoins_effective_value_test");
  std::operator<<((ostream *)&local_af8,"\" fixture setup");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_af8);
  local_b38 = (pbVar3->_M_dataplus)._M_p;
  local_b30 = local_b38 + pbVar3->_M_string_length;
  file_00.m_end = (iterator)0x5e9;
  file_00.m_begin = (iterator)&local_b28;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_00,(size_t)&local_b38,msg_00);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_af8);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_b48 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_b40 = "";
  memset(&local_af8,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_af8);
  std::operator<<((ostream *)&local_af8,'\"');
  std::operator<<((ostream *)&local_af8,"SelectCoins_effective_value_test");
  std::operator<<((ostream *)&local_af8,"\" test entry");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_af8);
  local_b58 = (pbVar3->_M_dataplus)._M_p;
  local_b50 = local_b58 + pbVar3->_M_string_length;
  file_01.m_end = (iterator)0x5e9;
  file_01.m_begin = (iterator)&local_b48;
  msg_01.m_end = in_R9;
  msg_01.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_01,(size_t)&local_b58,msg_01);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_af8);
  SelectCoins_effective_value_test::test_method(&t);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_b68 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_b60 = "";
  memset(&local_af8,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_af8);
  std::operator<<((ostream *)&local_af8,'\"');
  std::operator<<((ostream *)&local_af8,"SelectCoins_effective_value_test");
  std::operator<<((ostream *)&local_af8,"\" fixture teardown");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_af8);
  local_b78 = (pbVar3->_M_dataplus)._M_p;
  local_b70 = local_b78 + pbVar3->_M_string_length;
  file_02.m_end = (iterator)0x5e9;
  file_02.m_begin = (iterator)&local_b68;
  msg_02.m_end = in_R9;
  msg_02.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_02,(size_t)&local_b78,msg_02);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_af8);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_b88 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_b80 = "";
  memset(&local_af8,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_af8);
  std::operator<<((ostream *)&local_af8,'\"');
  std::operator<<((ostream *)&local_af8,"SelectCoins_effective_value_test");
  std::operator<<((ostream *)&local_af8,"\" fixture dtor");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_af8);
  local_b98 = (pbVar3->_M_dataplus)._M_p;
  local_b90 = local_b98 + pbVar3->_M_string_length;
  file_03.m_end = (iterator)0x5e9;
  file_03.m_begin = (iterator)&local_b88;
  msg_03.m_end = in_R9;
  msg_03.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_03,(size_t)&local_b98,msg_03);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_af8);
  WalletTestingSetup::~WalletTestingSetup(&t.super_BOOST_AUTO_TEST_CASE_FIXTURE);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(SelectCoins_effective_value_test)
{
    // Test that the effective value is used to check whether preset inputs provide sufficient funds when subtract_fee_outputs is not used.
    // This test creates a coin whose value is higher than the target but whose effective value is lower than the target.
    // The coin is selected using coin control, with m_allow_other_inputs = false. SelectCoins should fail due to insufficient funds.

    std::unique_ptr<CWallet> wallet = NewWallet(m_node);

    CoinsResult available_coins;
    {
        std::unique_ptr<CWallet> dummyWallet = NewWallet(m_node, /*wallet_name=*/"dummy");
        add_coin(available_coins, *dummyWallet, 100000); // 0.001 BTC
    }

    CAmount target{99900}; // 0.000999 BTC

    FastRandomContext rand;
    CoinSelectionParams cs_params{
        rand,
        /*change_output_size=*/34,
        /*change_spend_size=*/148,
        /*min_change_target=*/1000,
        /*effective_feerate=*/CFeeRate(3000),
        /*long_term_feerate=*/CFeeRate(1000),
        /*discard_feerate=*/CFeeRate(1000),
        /*tx_noinputs_size=*/0,
        /*avoid_partial=*/false,
    };
    CCoinControl cc;
    cc.m_allow_other_inputs = false;
    COutput output = available_coins.All().at(0);
    cc.SetInputWeight(output.outpoint, 148);
    cc.Select(output.outpoint).SetTxOut(output.txout);

    LOCK(wallet->cs_wallet);
    const auto preset_inputs = *Assert(FetchSelectedInputs(*wallet, cc, cs_params));
    available_coins.Erase({available_coins.coins[OutputType::BECH32].begin()->outpoint});

    const auto result = SelectCoins(*wallet, available_coins, preset_inputs, target, cc, cs_params);
    BOOST_CHECK(!result);
}